

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

Expression * __thiscall soul::Optimisations::Inliner::cloneExpression(Inliner *this,Expression *old)

{
  Module *pMVar1;
  bool bVar2;
  int iVar3;
  Constant *pCVar4;
  Constant *pCVar5;
  BinaryOperator *pBVar6;
  BinaryOperator *pBVar7;
  Expression *pEVar8;
  UnaryOperator *pUVar9;
  UnaryOperator *pUVar10;
  TypeCast *pTVar11;
  TypeCast *pTVar12;
  Expression *pEVar13;
  PureFunctionCall *__fn;
  undefined4 extraout_var;
  Variable *old_00;
  ArrayElement *old_01;
  StructElement *old_02;
  ProcessorProperty *pPVar14;
  ProcessorProperty *pPVar15;
  int in_ECX;
  Op *args_2;
  Type *args_2_00;
  void *__child_stack;
  Op *in_R8;
  pool_ptr<soul::heart::ProcessorProperty> local_78;
  pool_ptr<soul::heart::ProcessorProperty> pp;
  pool_ptr<soul::heart::StructElement> s_1;
  pool_ptr<soul::heart::ArrayElement> s;
  pool_ptr<soul::heart::Variable> v;
  pool_ptr<soul::heart::PureFunctionCall> f;
  pool_ptr<soul::heart::TypeCast> t;
  pool_ptr<soul::heart::UnaryOperator> u;
  pool_ptr<soul::heart::BinaryOperator> b;
  pool_ptr<soul::heart::Constant> local_28;
  pool_ptr<soul::heart::Constant> c;
  Expression *old_local;
  Inliner *this_local;
  
  c.object = (Constant *)old;
  cast<soul::heart::Constant,soul::heart::Expression>((soul *)&local_28,old);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar2) {
    pMVar1 = this->module;
    pCVar4 = pool_ptr<soul::heart::Constant>::operator->(&local_28);
    pCVar5 = pool_ptr<soul::heart::Constant>::operator->(&local_28);
    this_local = (Inliner *)
                 Module::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                           (pMVar1,&(pCVar4->super_Expression).super_Object.location,&pCVar5->value)
    ;
  }
  pool_ptr<soul::heart::Constant>::~pool_ptr(&local_28);
  if (!bVar2) {
    cast<soul::heart::BinaryOperator,soul::heart::Expression>
              ((soul *)&u,&(c.object)->super_Expression);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&u);
    if (bVar2) {
      pMVar1 = this->module;
      pBVar6 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&u);
      pBVar7 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&u);
      pEVar13 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pBVar7->lhs);
      pEVar13 = cloneExpression(this,pEVar13);
      pBVar7 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&u);
      pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pBVar7->rhs);
      pEVar8 = cloneExpression(this,pEVar8);
      pBVar7 = pool_ptr<soul::heart::BinaryOperator>::operator->
                         ((pool_ptr<soul::heart::BinaryOperator> *)&u);
      in_R8 = &pBVar7->operation;
      this_local = (Inliner *)
                   Module::
                   allocate<soul::heart::BinaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                             (pMVar1,&(pBVar6->super_Expression).super_Object.location,pEVar13,
                              pEVar8,in_R8);
      in_ECX = (int)pEVar8;
    }
    pool_ptr<soul::heart::BinaryOperator>::~pool_ptr((pool_ptr<soul::heart::BinaryOperator> *)&u);
    if (!bVar2) {
      cast<soul::heart::UnaryOperator,soul::heart::Expression>
                ((soul *)&t,&(c.object)->super_Expression);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t);
      if (bVar2) {
        pMVar1 = this->module;
        pUVar9 = pool_ptr<soul::heart::UnaryOperator>::operator->
                           ((pool_ptr<soul::heart::UnaryOperator> *)&t);
        pUVar10 = pool_ptr<soul::heart::UnaryOperator>::operator->
                            ((pool_ptr<soul::heart::UnaryOperator> *)&t);
        pEVar13 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pUVar10->source);
        pEVar13 = cloneExpression(this,pEVar13);
        pUVar10 = pool_ptr<soul::heart::UnaryOperator>::operator->
                            ((pool_ptr<soul::heart::UnaryOperator> *)&t);
        args_2 = &pUVar10->operation;
        this_local = (Inliner *)
                     Module::
                     allocate<soul::heart::UnaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::UnaryOp::Op&>
                               (pMVar1,&(pUVar9->super_Expression).super_Object.location,pEVar13,
                                args_2);
        in_ECX = (int)args_2;
      }
      pool_ptr<soul::heart::UnaryOperator>::~pool_ptr((pool_ptr<soul::heart::UnaryOperator> *)&t);
      if (!bVar2) {
        cast<soul::heart::TypeCast,soul::heart::Expression>
                  ((soul *)&f,&(c.object)->super_Expression);
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&f);
        if (bVar2) {
          pMVar1 = this->module;
          pTVar11 = pool_ptr<soul::heart::TypeCast>::operator->
                              ((pool_ptr<soul::heart::TypeCast> *)&f);
          pTVar12 = pool_ptr<soul::heart::TypeCast>::operator->
                              ((pool_ptr<soul::heart::TypeCast> *)&f);
          pEVar13 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pTVar12->source);
          pEVar13 = cloneExpression(this,pEVar13);
          pTVar12 = pool_ptr<soul::heart::TypeCast>::operator->
                              ((pool_ptr<soul::heart::TypeCast> *)&f);
          args_2_00 = &pTVar12->destType;
          this_local = (Inliner *)
                       Module::
                       allocate<soul::heart::TypeCast,soul::CodeLocation&,soul::heart::Expression&,soul::Type&>
                                 (pMVar1,&(pTVar11->super_Expression).super_Object.location,pEVar13,
                                  args_2_00);
          in_ECX = (int)args_2_00;
        }
        pool_ptr<soul::heart::TypeCast>::~pool_ptr((pool_ptr<soul::heart::TypeCast> *)&f);
        if (!bVar2) {
          cast<soul::heart::PureFunctionCall,soul::heart::Expression>
                    ((soul *)&v,&(c.object)->super_Expression);
          bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&v);
          if (bVar2) {
            __fn = pool_ptr<soul::heart::PureFunctionCall>::operator*
                             ((pool_ptr<soul::heart::PureFunctionCall> *)&v);
            iVar3 = clone(this,(__fn *)__fn,__child_stack,in_ECX,in_R8);
            this_local = (Inliner *)CONCAT44(extraout_var,iVar3);
          }
          pool_ptr<soul::heart::PureFunctionCall>::~pool_ptr
                    ((pool_ptr<soul::heart::PureFunctionCall> *)&v);
          if (!bVar2) {
            cast<soul::heart::Variable,soul::heart::Expression>
                      ((soul *)&s,&(c.object)->super_Expression);
            bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&s);
            if (bVar2) {
              old_00 = pool_ptr<soul::heart::Variable>::operator*
                                 ((pool_ptr<soul::heart::Variable> *)&s);
              this_local = (Inliner *)getRemappedVariable(this,old_00);
            }
            pool_ptr<soul::heart::Variable>::~pool_ptr((pool_ptr<soul::heart::Variable> *)&s);
            if (!bVar2) {
              cast<soul::heart::ArrayElement,soul::heart::Expression>
                        ((soul *)&s_1,&(c.object)->super_Expression);
              bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&s_1);
              if (bVar2) {
                old_01 = pool_ptr<soul::heart::ArrayElement>::operator*
                                   ((pool_ptr<soul::heart::ArrayElement> *)&s_1);
                this_local = (Inliner *)cloneArrayElement(this,old_01);
              }
              pool_ptr<soul::heart::ArrayElement>::~pool_ptr
                        ((pool_ptr<soul::heart::ArrayElement> *)&s_1);
              if (!bVar2) {
                cast<soul::heart::StructElement,soul::heart::Expression>
                          ((soul *)&pp,&(c.object)->super_Expression);
                bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&pp);
                if (bVar2) {
                  old_02 = pool_ptr<soul::heart::StructElement>::operator*
                                     ((pool_ptr<soul::heart::StructElement> *)&pp);
                  this_local = (Inliner *)cloneStructElement(this,old_02);
                }
                pool_ptr<soul::heart::StructElement>::~pool_ptr
                          ((pool_ptr<soul::heart::StructElement> *)&pp);
                if (!bVar2) {
                  cast<soul::heart::ProcessorProperty,soul::heart::Expression>
                            ((soul *)&local_78,&(c.object)->super_Expression);
                  pMVar1 = this->module;
                  pPVar14 = pool_ptr<soul::heart::ProcessorProperty>::operator->(&local_78);
                  pPVar15 = pool_ptr<soul::heart::ProcessorProperty>::operator->(&local_78);
                  this_local = (Inliner *)
                               Module::
                               allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property_const&>
                                         (pMVar1,&(pPVar14->super_Expression).super_Object.location,
                                          &pPVar15->property);
                  pool_ptr<soul::heart::ProcessorProperty>::~pool_ptr(&local_78);
                }
              }
            }
          }
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

heart::Expression& cloneExpression (heart::Expression& old)
        {
            if (auto c = cast<heart::Constant> (old))
                return module.allocate<heart::Constant> (c->location, c->value);

            if (auto b = cast<heart::BinaryOperator> (old))
                return module.allocate<heart::BinaryOperator> (b->location,
                                                               cloneExpression (b->lhs),
                                                               cloneExpression (b->rhs),
                                                               b->operation);

            if (auto u = cast<heart::UnaryOperator> (old))
                return module.allocate<heart::UnaryOperator> (u->location, cloneExpression (u->source), u->operation);

            if (auto t = cast<heart::TypeCast> (old))
                return module.allocate<heart::TypeCast> (t->location, cloneExpression (t->source), t->destType);

            if (auto f = cast<heart::PureFunctionCall> (old))
                return clone (*f);

            if (auto v = cast<heart::Variable> (old))
                return getRemappedVariable (*v);

            if (auto s = cast<heart::ArrayElement> (old))
                return cloneArrayElement (*s);

            if (auto s = cast<heart::StructElement> (old))
                return cloneStructElement (*s);

            auto pp = cast<heart::ProcessorProperty> (old);
            return module.allocate<heart::ProcessorProperty> (pp->location, pp->property);
        }